

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.h
# Opt level: O0

Span<const_google::protobuf::json_internal::UntypedMessage::Bool> __thiscall
google::protobuf::json_internal::UntypedMessage::
Get<google::protobuf::json_internal::UntypedMessage::Bool>
          (UntypedMessage *this,int32_t field_number)

{
  bool bVar1;
  pointer ppVar2;
  LogMessage *pLVar3;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  LogMessageFatal local_70 [23];
  Voidify local_59;
  add_pointer_t<const_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>_> local_58;
  vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>
  *vec;
  Bool *val;
  undefined1 local_38 [8];
  const_iterator it;
  int32_t field_number_local;
  UntypedMessage *this_local;
  
  it.inner_.field_1._4_4_ = field_number;
  _local_38 = (iterator)
              absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::find<int>
                        ((raw_hash_set<_2385b75b_> *)&this->fields_,
                         (key_arg<int> *)((long)&it.inner_.field_1 + 4));
  _val = (iterator)
         absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::end
                   ((raw_hash_set<_2385b75b_> *)&this->fields_);
  bVar1 = absl::lts_20240722::container_internal::operator==
                    ((const_iterator *)local_38,(const_iterator *)&val);
  if (bVar1) {
    absl::lts_20240722::Span<const_google::protobuf::json_internal::UntypedMessage::Bool>::Span
              ((Span<const_google::protobuf::json_internal::UntypedMessage::Bool> *)&this_local);
  }
  else {
    ppVar2 = absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::const_iterator::
             operator->((const_iterator *)local_38);
    vec = (vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>
           *)std::
             get_if<google::protobuf::json_internal::UntypedMessage::Bool,google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>
                       (&ppVar2->second);
    if (vec == (vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>
                *)0x0) {
      ppVar2 = absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::const_iterator::
               operator->((const_iterator *)local_38);
      local_58 = std::
                 get_if<std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>
                           (&ppVar2->second);
      if (local_58 ==
          (add_pointer_t<const_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>_>)
          0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,"false");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_70,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/json/internal/untyped_message.h"
                   ,0xc9,local_80._M_len,local_80._M_str);
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_70);
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           (pLVar3,(char (*) [36])"wrong type for UntypedMessage::Get(");
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           (pLVar3,it.inner_.field_1._4_4_);
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           (pLVar3,(char (*) [2])0x65531d);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_59,pLVar3);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_70);
      }
      absl::lts_20240722::Span<google::protobuf::json_internal::UntypedMessage::Bool_const>::
      Span<std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,void,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,int>
                ((Span<google::protobuf::json_internal::UntypedMessage::Bool_const> *)&this_local,
                 local_58);
    }
    else {
      absl::lts_20240722::Span<const_google::protobuf::json_internal::UntypedMessage::Bool>::Span
                ((Span<const_google::protobuf::json_internal::UntypedMessage::Bool> *)&this_local,
                 (pointer)vec,1);
    }
  }
  return _this_local;
}

Assistant:

absl::Span<const T> Get(int32_t field_number) const {
    auto it = fields_.find(field_number);
    if (it == fields_.end()) {
      return {};
    }

    if (auto* val = absl::get_if<T>(&it->second)) {
      return absl::Span<const T>(val, 1);
    } else if (auto* vec = absl::get_if<std::vector<T>>(&it->second)) {
      return *vec;
    } else {
      ABSL_CHECK(false) << "wrong type for UntypedMessage::Get(" << field_number
                        << ")";
      return {};  // avoid compiler warning.
    }
  }